

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O0

JSValue js_worker_get_onmessage(JSContext *ctx,JSValue this_val)

{
  JSValue JVar1;
  void *pvVar2;
  undefined8 in_RDX;
  JSContext *in_RSI;
  JSContext *in_RDI;
  JSValue JVar3;
  JSWorkerMessageHandler *port;
  JSWorkerData *worker;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 uVar4;
  undefined4 in_stack_fffffffffffffff4;
  undefined8 local_8;
  
  JVar3.tag._0_4_ = in_stack_fffffffffffffff0;
  JVar3.u = (JSValueUnion)in_RDX;
  JVar3.tag._4_4_ = in_stack_fffffffffffffff4;
  pvVar2 = JS_GetOpaque2(in_RSI,JVar3,(JSClassID)((ulong)in_RDI >> 0x20));
  if (pvVar2 == (void *)0x0) {
    uVar4 = 0;
    local_8 = 6;
  }
  else if (*(long *)((long)pvVar2 + 0x10) == 0) {
    uVar4 = 0;
    local_8 = 2;
  }
  else {
    JVar3 = JS_DupValue(in_RDI,*(JSValue *)(*(long *)((long)pvVar2 + 0x10) + 0x18));
    uVar4 = JVar3.u._0_4_;
    in_stack_fffffffffffffff4 = JVar3.u._4_4_;
    local_8 = JVar3.tag;
  }
  JVar1.u._4_4_ = in_stack_fffffffffffffff4;
  JVar1.u.int32 = uVar4;
  JVar1.tag = local_8;
  return JVar1;
}

Assistant:

static JSValue js_worker_get_onmessage(JSContext *ctx, JSValueConst this_val)
{
    JSWorkerData *worker = JS_GetOpaque2(ctx, this_val, js_worker_class_id);
    JSWorkerMessageHandler *port;
    if (!worker)
        return JS_EXCEPTION;
    port = worker->msg_handler;
    if (port) {
        return JS_DupValue(ctx, port->on_message_func);
    } else {
        return JS_NULL;
    }
}